

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O1

KLVFilePacket * __thiscall
ASDCP::KLVFilePacket::WriteKLToFile(KLVFilePacket *this,FileWriter *Writer,UL *label,ui32_t length)

{
  char cVar1;
  undefined4 in_register_0000000c;
  undefined1 *puVar2;
  ulong in_R8;
  ui32_t write_count;
  byte_t buffer [20];
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uchar local_98 [16];
  Result_t local_88 [104];
  
  local_a8 = *(undefined8 *)(CONCAT44(in_register_0000000c,length) + 9);
  uStack_a0 = *(undefined8 *)(CONCAT44(in_register_0000000c,length) + 0x11);
  cVar1 = Kumu::write_BER(local_98,in_R8 & 0xffffffff,4);
  if (cVar1 == '\0') {
    puVar2 = Kumu::RESULT_FAIL;
  }
  else {
    Kumu::FileWriter::Write((uchar *)local_88,(uint)label,(uint *)&local_a8);
    Kumu::Result_t::~Result_t(local_88);
    if (local_ac != 0x14) {
      __assert_fail("write_count == kl_length",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KLV.cpp"
                    ,0x144,
                    "virtual ASDCP::Result_t ASDCP::KLVFilePacket::WriteKLToFile(Kumu::FileWriter &, const UL &, ui32_t)"
                   );
    }
    puVar2 = Kumu::RESULT_OK;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar2);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVFilePacket::WriteKLToFile(Kumu::FileWriter& Writer, const UL& label, ui32_t length)
{
  byte_t buffer[kl_length];
  memcpy(buffer, label.Value(), label.Size());

  if ( ! Kumu::write_BER(buffer+SMPTE_UL_LENGTH, length, MXF_BER_LENGTH) )
    return RESULT_FAIL;

  ui32_t write_count;
  Writer.Write(buffer, kl_length, &write_count);
  assert(write_count == kl_length);
  return RESULT_OK;
}